

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::_::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  StringPtr *this_00;
  ulong uVar4;
  size_t sVar5;
  char *__s;
  size_t __n;
  Fault f;
  StringPtr pattern_local;
  Array<char> addr_heap;
  char addr_stack [128];
  
  sVar5 = pattern.content.size_;
  __s = pattern.content.ptr;
  pattern_local.content.ptr = __s;
  pattern_local.content.size_ = sVar5;
  pvVar3 = memchr(__s,0x2f,sVar5 - 1);
  if (pvVar3 == (void *)0x0) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              ((Fault *)addr_stack,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7cb,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",&pattern_local);
    Debug::Fault::fatal((Fault *)addr_stack);
  }
  __n = (long)pvVar3 - (long)__s;
  addr_heap.size_ = __n + 1;
  addr_stack._0_8_ = (long)pvVar3 + 1;
  addr_stack._8_8_ = sVar5 - addr_heap.size_;
  this_00 = (StringPtr *)addr_stack;
  uVar1 = StringPtr::parseAs<unsigned_int>(this_00);
  this->bitCount = uVar1;
  if (addr_heap.size_ < 0x81) {
    addr_heap.ptr = (char *)0x0;
    addr_heap.size_ = 0;
    addr_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    this_00 = (StringPtr *)
              HeapArrayDisposer::allocateImpl
                        (1,addr_heap.size_,addr_heap.size_,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
    addr_heap.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
    addr_heap.ptr = (char *)this_00;
  }
  memcpy(this_00,pattern_local.content.ptr,__n);
  *(undefined1 *)((long)this_00 + __n) = 0;
  pvVar3 = memchr(pattern_local.content.ptr,0x3a,pattern_local.content.size_ - 1);
  if (pvVar3 == (void *)0x0) {
    this->family = 2;
    if (0x20 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d5,FAILED,"bitCount <= 32","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
  }
  else {
    this->family = 10;
    if (0x80 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d8,FAILED,"bitCount <= 128","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
  }
  iVar2 = inet_pton(this->family,(char *)this_00,this->bits);
  if (iVar2 < 1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7db,FAILED,"inet_pton(family, addr.begin(), bits) > 0","\"invalid CIDR\", pattern"
               ,(char (*) [13])"invalid CIDR",&pattern_local);
    Debug::Fault::fatal(&f);
  }
  uVar1 = this->bitCount;
  if (uVar1 < 0x80) {
    this->bits[uVar1 >> 3] = this->bits[uVar1 >> 3] & (byte)(0xff00 >> ((byte)uVar1 & 7));
    uVar4 = (ulong)(this->bitCount >> 3);
    memset(this->bits + uVar4 + 1,0,0xf - uVar4);
  }
  if (addr_heap.ptr != (char *)0x0) {
    (**(addr_heap.disposer)->_vptr_ArrayDisposer)
              (addr_heap.disposer,addr_heap.ptr,1,addr_heap.size_,addr_heap.size_,0);
  }
  return;
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == nullptr) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}